

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O0

void EbIb(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  (pMyDisasm->Operand2).OpType = 0x8040000;
  (pMyDisasm->Operand2).OpSize = 8;
  (pMyDisasm->Reserved_).ImmediatSize = 8;
  (pMyDisasm->Reserved_).MemDecoration = 1;
  (pMyDisasm->Reserved_).OperandSize = 8;
  decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).OperandSize = 0x20;
  (pMyDisasm->Reserved_).EIP_ =
       (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 3) + (pMyDisasm->Reserved_).EIP_;
  iVar1 = Security(0,pMyDisasm);
  if (iVar1 != 0) {
    CopyFormattedNumber(pMyDisasm,(pMyDisasm->Operand2).OpMnemonic,"%.2X",
                        (long)*(char *)((pMyDisasm->Reserved_).EIP_ - 1));
    (pMyDisasm->Instruction).Immediat = (ulong)*(byte *)((pMyDisasm->Reserved_).EIP_ - 1);
  }
  return;
}

Assistant:

void __bea_callspec__ EbIb(PDISASM pMyDisasm)
{
  pMyDisasm->Operand2.OpType = CONSTANT_TYPE+ABSOLUTE_;
  pMyDisasm->Operand2.OpSize = 8;
  GV.ImmediatSize = 8;
  GV.MemDecoration = Arg1byte;
  GV.OperandSize = 8;
  decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
  GV.OperandSize = 32;
  GV.EIP_ += GV.DECALAGE_EIP+3;
  if (!Security(0, pMyDisasm)) return;
  #ifndef BEA_LIGHT_DISASSEMBLY
    (void) CopyFormattedNumber(pMyDisasm, (char*) &pMyDisasm->Operand2.OpMnemonic,"%.2X",(Int64)*((Int8*) (GV.EIP_-1)));
  #endif
  pMyDisasm->Instruction.Immediat = *((UInt8*) (GV.EIP_-1));
}